

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

bool cmTargetLinkLibrariesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  pointer puVar2;
  pointer pcVar3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  int iVar7;
  cmTargetLinkLibraryType llt;
  cmake *pcVar8;
  cmTarget *pcVar9;
  string *psVar10;
  ostream *poVar11;
  size_t sVar12;
  cmMakefile *pcVar13;
  const_iterator cVar14;
  cmValue cVar15;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  pointer puVar16;
  long *plVar17;
  undefined7 uVar19;
  ulong uVar18;
  pointer pbVar20;
  ProcessingState currentProcessingState;
  ProcessingState PVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  long lVar26;
  ulong uVar27;
  cmMakefile *this;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  currentEntry;
  TLL tll;
  ostringstream e;
  cmDirectoryId dirId;
  long local_2d0;
  undefined1 local_2b1;
  string local_2b0;
  char local_290;
  cmTarget *local_288;
  undefined1 local_280 [24];
  string local_268 [8];
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  __node_base_ptr *local_248;
  size_type local_240;
  __node_base local_238;
  size_type sStack_230;
  float local_228;
  size_t local_220;
  __node_base_ptr p_Stack_218;
  ProcessingState local_210;
  uint local_20c;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 *local_1c8;
  pointer local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  ios_base *local_188 [2];
  ios_base local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  long *local_e8 [2];
  long local_d8 [2];
  undefined1 local_c8 [88];
  undefined1 local_70 [48];
  cmMakefile *local_40;
  ulong local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  
  psVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003cad13:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
    }
    return false;
  }
  this = status->Makefile;
  bVar4 = cmMakefile::IsAlias(this,psVar10);
  if (bVar4) {
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"can not be used on an ALIAS target.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_003cad13;
  }
  pcVar8 = cmMakefile::GetCMakeInstance(this);
  pcVar9 = cmGlobalGenerator::FindTarget
                     ((pcVar8->GlobalGenerator)._M_t.
                      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                      .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,false);
  if (pcVar9 == (cmTarget *)0x0) {
    puVar2 = (this->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (this->ImportedTargetsOwned).
                   super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar2;
        puVar16 = puVar16 + 1) {
      psVar10 = cmTarget::GetName_abi_cxx11_
                          ((puVar16->_M_t).
                           super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
                           super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                           super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl);
      pbVar20 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar12 = psVar10->_M_string_length;
      if ((sVar12 == pbVar20->_M_string_length) &&
         ((sVar12 == 0 ||
          (iVar7 = bcmp((psVar10->_M_dataplus)._M_p,(pbVar20->_M_dataplus)._M_p,sVar12), iVar7 == 0)
          ))) {
        pcVar9 = (puVar16->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>.
                 _M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                 super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
        if (pcVar9 != (cmTarget *)0x0) goto LAB_003cad6c;
        break;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Cannot specify link libraries for target \"",0x2a);
    pbVar20 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,(pbVar20->_M_dataplus)._M_p,pbVar20->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"which is not built by this project.",0x23);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      PVar6 = cmMakefile::GetPolicyStatus(this,CMP0016,false);
      if (PVar6 - REQUIRED_IF_USED < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
        cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_280,(cmPolicies *)0x10,id_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,(char *)local_280._0_8_,local_280._8_8_);
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_,
                          CONCAT53(local_280._19_5_,
                                   CONCAT12(local_280[0x12],
                                            CONCAT11(local_280[0x11],local_280[0x10]))) + 1);
        }
      }
      else {
        if (PVar6 == OLD) goto LAB_003cba2c;
        if (PVar6 == WARN) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,
                     "CMake does not support this but it used to work accidentally ",0x3d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"and is being allowed for compatibility.",0x27);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_280,(cmPolicies *)0x10,id_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,(char *)local_280._0_8_,local_280._8_8_);
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_,
                            CONCAT53(local_280._19_5_,
                                     CONCAT12(local_280[0x12],
                                              CONCAT11(local_280[0x11],local_280[0x10]))) + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this,AUTHOR_WARNING,(string *)local_280);
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_,
                            CONCAT53(local_280._19_5_,
                                     CONCAT12(local_280[0x12],
                                              CONCAT11(local_280[0x11],local_280[0x10]))) + 1);
          }
          goto LAB_003cba2c;
        }
      }
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_280);
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,
                      CONCAT53(local_280._19_5_,
                               CONCAT12(local_280[0x12],CONCAT11(local_280[0x11],local_280[0x10])))
                      + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
LAB_003cba2c:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    return true;
  }
LAB_003cad6c:
  TVar5 = cmTarget::GetType(pcVar9);
  if (TVar5 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    PVar6 = cmMakefile::GetPolicyStatus(this,CMP0039,false);
    if (PVar6 - NEW < 3) {
      pcVar25 = "must";
      t = FATAL_ERROR;
      bVar4 = true;
LAB_003cae80:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Utility target \"",0x10);
      psVar10 = cmTarget::GetName_abi_cxx11_(pcVar9);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(psVar10->_M_dataplus)._M_p,
                           psVar10->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
      sVar12 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar25,sVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," not be used as the target of a target_link_libraries call.",0x3b);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this,t,(string *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,
                        CONCAT53(local_280._19_5_,
                                 CONCAT12(local_280[0x12],CONCAT11(local_280[0x11],local_280[0x10]))
                                ) + 1);
      }
      if (bVar4) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        return false;
      }
    }
    else if (PVar6 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_280,(cmPolicies *)&DAT_00000027,id);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(char *)local_280._0_8_,local_280._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,
                        CONCAT53(local_280._19_5_,
                                 CONCAT12(local_280[0x12],CONCAT11(local_280[0x11],local_280[0x10]))
                                ) + 1);
      }
      pcVar25 = "should";
      bVar4 = false;
      t = AUTHOR_WARNING;
      goto LAB_003cae80;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
  }
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    return true;
  }
  local_268 = (string  [8])&local_258;
  local_280[0x10] = '\0';
  local_280[0x11] = '\0';
  local_280[0x12] = '\0';
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_248 = &p_Stack_218;
  local_240 = 1;
  local_238._M_nxt = (_Hash_node_base *)0x0;
  sStack_230 = 0;
  local_228 = 1.0;
  local_220 = 0;
  p_Stack_218 = (__node_base_ptr)0x0;
  local_280._0_8_ = this;
  local_280._8_8_ = pcVar9;
  pcVar13 = cmTarget::GetMakefile(pcVar9);
  if (pcVar13 != this) {
    PVar6 = cmMakefile::GetPolicyStatus((cmMakefile *)local_280._0_8_,CMP0079,false);
    if (PVar6 - NEW < 3) {
      local_280[0x12] = '\x01';
    }
    else {
      if (PVar6 != OLD) {
        if (PVar6 != WARN) goto LAB_003cb1da;
        local_280[0x10] = '\x01';
      }
      local_280[0x11] = '\x01';
    }
  }
LAB_003cb1da:
  if (local_280[0x12] == '\x01') {
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_70,(cmMakefile *)local_280._0_8_);
    local_1e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3;
    local_1e8._8_8_ = "::@";
    local_1d8._M_allocated_capacity = local_70._8_8_;
    local_1d8._8_8_ = local_70._0_8_;
    views._M_len = 2;
    views._M_array = (iterator)local_1e8;
    cmCatViews_abi_cxx11_(&local_2b0,views);
    std::__cxx11::string::operator=(local_268,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
    }
  }
  local_290 = '\0';
  if ((cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keywords_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::keywords_abi_cxx11_), iVar7 != 0)) {
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"LINK_INTERFACE_LIBRARIES","");
    local_1c8 = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"INTERFACE","");
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"LINK_PUBLIC","");
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"PUBLIC","");
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"LINK_PRIVATE","");
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"PRIVATE","");
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"debug","");
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"optimized","");
    plVar17 = local_d8;
    local_e8[0] = plVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"general","");
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,local_1e8,local_c8,0,local_70,&local_208,&local_2b1);
    lVar26 = -0x120;
    do {
      if (plVar17 != (long *)plVar17[-2]) {
        operator_delete((long *)plVar17[-2],*plVar17 + 1);
      }
      plVar17 = plVar17 + -4;
      lVar26 = lVar26 + 0x20;
    } while (lVar26 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,
                 &cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keywords_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keywords_abi_cxx11_);
  }
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20)) {
    llt = GENERAL_LibraryType;
    uVar23 = 1;
    currentProcessingState = ProcessingLinkLibraries;
    uVar18 = 0;
    local_2d0 = 0;
    local_288 = pcVar9;
    local_40 = this;
LAB_003cb2e0:
    cVar14 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                     ::keywords_abi_cxx11_._M_h,pbVar20 + uVar23);
    uVar24 = uVar23;
    if (cVar14.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      if ((uVar18 & 1) != 0) {
        if (local_290 == '\x01') {
          __assert_fail("!currentEntry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                        ,0x142,
                        "bool cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                       );
        }
        bVar4 = anon_unknown.dwarf_160af51::TLL::HandleLibrary
                          ((TLL *)local_280,currentProcessingState,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar23,llt);
        uVar18 = 0;
        llt = GENERAL_LibraryType;
        if (!bVar4) goto LAB_003cbd83;
        goto LAB_003cb8d2;
      }
      pbVar20 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar24 = pbVar20[uVar23]._M_string_length;
      local_38 = uVar23;
      if (uVar24 != 0) {
        pcVar3 = pbVar20[uVar23]._M_dataplus._M_p;
        uVar27 = 0;
        local_210 = currentProcessingState;
        local_20c = (uint)uVar18;
        do {
          pcVar1 = pcVar3 + uVar27;
          __str._M_str = "$<";
          __str._M_len = 2;
          local_1e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(uVar24 - uVar27);
          local_1e8._8_8_ = pcVar1;
          iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_1e8,0,2,__str
                            );
          if (iVar7 == 0) {
            local_2d0 = local_2d0 + 1;
            uVar27 = uVar27 + 1;
          }
          else if (local_2d0 == 0) {
            local_2d0 = 0;
          }
          else {
            __str_00._M_str = ">";
            __str_00._M_len = 1;
            local_1e8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(uVar24 - uVar27);
            local_1e8._8_8_ = pcVar1;
            iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_1e8,0,1,
                               __str_00);
            local_2d0 = local_2d0 - (ulong)(iVar7 == 0);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < uVar24);
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = (ulong)local_20c;
        this = local_40;
        currentProcessingState = local_210;
      }
      uVar24 = local_38;
      __u = pbVar20 + uVar23;
      if (local_290 == '\x01') {
        local_70._0_8_ = (char *)0x1;
        local_1d8._8_8_ = local_70 + 0x10;
        local_70[0x10] = ';';
        local_1e8._0_8_ = local_2b0._M_string_length;
        local_1e8._8_8_ = local_2b0._M_dataplus._M_p;
        local_1d8._M_allocated_capacity = 1;
        local_1c0 = (__u->_M_dataplus)._M_p;
        local_1c8 = (undefined1 *)__u->_M_string_length;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_1e8;
        local_70._8_8_ = local_1d8._8_8_;
        cmCatViews_abi_cxx11_(&local_208,views_00);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&local_2b0,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&local_2b0,__u);
      }
      if (local_2d0 != 0) goto LAB_003cb8d2;
      if (local_290 != '\x01') goto LAB_003cb4ba;
      bVar4 = anon_unknown.dwarf_160af51::TLL::HandleLibrary
                        ((TLL *)local_280,currentProcessingState,&local_2b0,GENERAL_LibraryType);
      if (!bVar4) goto LAB_003cb982;
      if ((local_290 == '\x01') &&
         (local_290 = '\0',
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (local_290 == '\x01') {
        if ((uVar18 & 1) != 0) goto LAB_003cb90a;
        bVar4 = anon_unknown.dwarf_160af51::TLL::HandleLibrary
                          ((TLL *)local_280,currentProcessingState,&local_2b0,GENERAL_LibraryType);
        if (!bVar4) goto LAB_003cb982;
        if ((local_290 == '\x01') &&
           (local_290 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar23));
      iVar22 = (int)uVar23;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar23));
        if (iVar7 == 0) {
          if ((iVar22 == 1) || (currentProcessingState == ProcessingKeywordLinkInterface)) {
            local_2d0 = 0;
            currentProcessingState = ProcessingKeywordLinkInterface;
          }
          else {
            PVar21 = currentProcessingState & ~ProcessingKeywordLinkInterface;
            local_2d0 = 0;
            currentProcessingState = ProcessingKeywordLinkInterface;
            if (PVar21 != ProcessingKeywordPublicInterface) {
              local_1e8._0_8_ = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,
                         "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                         ,"");
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1e8);
              goto LAB_003cbd63;
            }
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar23));
          if (iVar7 == 0) {
            if ((iVar22 == 1) || (currentProcessingState == ProcessingPlainPrivateInterface)) {
              local_2d0 = 0;
              currentProcessingState = ProcessingPlainPublicInterface;
            }
            else {
              local_2d0 = 0;
              bVar4 = currentProcessingState != ProcessingPlainPublicInterface;
              currentProcessingState = ProcessingPlainPublicInterface;
              if (bVar4) {
                local_1e8._0_8_ = &local_1d8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e8,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,"");
                cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1e8);
                goto LAB_003cbd63;
              }
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar23));
            if (iVar7 == 0) {
              if ((iVar22 == 1) || (currentProcessingState == ProcessingKeywordLinkInterface)) {
                local_2d0 = 0;
                currentProcessingState = ProcessingKeywordPublicInterface;
              }
              else {
                PVar21 = currentProcessingState & ~ProcessingKeywordLinkInterface;
                local_2d0 = 0;
                currentProcessingState = ProcessingKeywordPublicInterface;
                if (PVar21 != ProcessingKeywordPublicInterface) {
                  local_1e8._0_8_ = &local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e8,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,"");
                  cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1e8);
                  goto LAB_003cbd63;
                }
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar23));
              if (iVar7 == 0) {
                if ((iVar22 == 1) || (currentProcessingState == ProcessingPlainPublicInterface)) {
                  local_2d0 = 0;
                  currentProcessingState = ProcessingPlainPrivateInterface;
                }
                else {
                  local_2d0 = 0;
                  bVar4 = currentProcessingState != ProcessingPlainPrivateInterface;
                  currentProcessingState = ProcessingPlainPrivateInterface;
                  if (bVar4) {
                    local_1e8._0_8_ = &local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1e8,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,"");
                    cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1e8);
                    goto LAB_003cbd63;
                  }
                }
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar23));
                if (iVar7 == 0) {
                  if ((iVar22 == 1) || (currentProcessingState == ProcessingKeywordLinkInterface)) {
                    local_2d0 = 0;
                    currentProcessingState = ProcessingKeywordPrivateInterface;
                  }
                  else {
                    PVar21 = currentProcessingState & ~ProcessingKeywordLinkInterface;
                    local_2d0 = 0;
                    currentProcessingState = ProcessingKeywordPrivateInterface;
                    if (PVar21 != ProcessingKeywordPublicInterface) {
                      local_1e8._0_8_ = &local_1d8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1e8,
                                 "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,"");
                      cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1e8);
                      goto LAB_003cbd63;
                    }
                  }
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar23));
                  uVar19 = (undefined7)(uVar18 >> 8);
                  if (iVar7 == 0) {
                    if ((uVar18 & 1) != 0) {
                      LinkLibraryTypeSpecifierWarning(this,llt,1);
                      llt = DEBUG_LibraryType;
                      goto LAB_003cb897;
                    }
                    llt = DEBUG_LibraryType;
LAB_003cb8aa:
                    local_2d0 = 0;
                    uVar18 = CONCAT71(uVar19,1);
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar23)
                                      );
                    if (iVar7 == 0) {
                      if ((uVar18 & 1) == 0) {
                        llt = OPTIMIZED_LibraryType;
                        goto LAB_003cb8aa;
                      }
                      LinkLibraryTypeSpecifierWarning(this,llt,2);
                      llt = OPTIMIZED_LibraryType;
LAB_003cb897:
                      local_2d0 = 0;
                      uVar18 = CONCAT71(uVar19,1);
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar23));
                      if (iVar7 != 0) goto LAB_003cb4ba;
                      if ((uVar18 & 1) != 0) {
                        LinkLibraryTypeSpecifierWarning(this,llt,0);
                      }
                      local_2d0 = 0;
                      uVar18 = CONCAT71(uVar19,1);
                      llt = GENERAL_LibraryType;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_003cb8d2;
      }
      if (iVar22 != 1) {
        local_1e8._0_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,
                   "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                   ,"");
        cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1e8);
LAB_003cbd63:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._0_8_ != &local_1d8) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
        }
        uVar18 = 1;
        goto LAB_003cbd83;
      }
      currentProcessingState = ProcessingPlainLinkInterface;
    }
LAB_003cb4ba:
    local_2d0 = 0;
LAB_003cb8d2:
    uVar23 = (ulong)((int)uVar24 + 1);
    pbVar20 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5) <= uVar23)
    goto code_r0x003cb8f4;
    goto LAB_003cb2e0;
  }
  currentProcessingState = ProcessingLinkLibraries;
  if (local_290 != '\0') goto LAB_003cb937;
  goto LAB_003cbb06;
code_r0x003cb8f4:
  pcVar9 = local_288;
  if (local_290 == '\0') {
    if ((uVar18 & 1) != 0) {
      local_1e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x5;
      local_1e8._8_8_ = "The \"";
      pcVar25 = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)llt * 8);
      local_70._0_8_ = strlen(pcVar25);
      local_70._8_8_ = pcVar25;
      cmStrCat<char[42]>(&local_208,(cmAlphaNum *)local_1e8,(cmAlphaNum *)local_70,
                         (char (*) [42])"\" argument must be followed by a library.");
      cmMakefile::IssueMessage(this,FATAL_ERROR,&local_208);
      pcVar9 = local_288;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
  }
  else {
    if ((uVar18 & 1) != 0) {
LAB_003cb90a:
      __assert_fail("!haveLLT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                    ,0xc1,
                    "auto cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)::(anonymous class)::operator()() const"
                   );
    }
LAB_003cb937:
    bVar4 = anon_unknown.dwarf_160af51::TLL::HandleLibrary
                      ((TLL *)local_280,currentProcessingState,&local_2b0,GENERAL_LibraryType);
    if (!bVar4) {
LAB_003cb982:
      uVar18 = 0;
      goto LAB_003cbd83;
    }
    if ((local_290 == '\x01') &&
       (local_290 = '\0',
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_003cbb06:
  PVar6 = cmTarget::GetPolicyStatus(pcVar9,CMP0022);
  uVar18 = 1;
  if (currentProcessingState != ProcessingLinkLibraries && PVar6 < NEW) {
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"LINK_INTERFACE_LIBRARIES","");
    cVar15 = cmTarget::GetProperty(pcVar9,(string *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
    }
    if (cVar15.Value == (string *)0x0) {
      local_1e8._0_8_ = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"LINK_INTERFACE_LIBRARIES","");
      cmTarget::SetProperty(pcVar9,(string *)local_1e8,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != &local_1d8) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._M_allocated_capacity + 1));
      }
    }
  }
LAB_003cbd83:
  if ((local_290 == '\x01') &&
     (local_290 = '\0',
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_2b0._M_dataplus._M_p != &local_2b0.field_2)) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  anon_unknown.dwarf_160af51::TLL::~TLL((TLL *)local_280);
  return SUB81(uVar18,0);
}

Assistant:

bool cmTargetLinkLibrariesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  // Must have at least one argument.
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Alias targets cannot be on the LHS of this command.
  if (mf.IsAlias(args[0])) {
    status.SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  cmTarget* target =
    mf.GetCMakeInstance()->GetGlobalGenerator()->FindTarget(args[0]);
  if (!target) {
    for (const auto& importedTarget : mf.GetOwnedImportedTargets()) {
      if (importedTarget->GetName() == args[0]) {
        target = importedTarget.get();
        break;
      }
    }
  }
  if (!target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (mf.GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        mf.IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccurred();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (modal) {
      e << "Utility target \"" << target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  TLL tll(mf, target);

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  ProcessingState currentProcessingState = ProcessingLinkLibraries;

  // Accumulate consectuive non-keyword arguments into one entry in
  // order to handle unquoted generator expressions containing ';'.
  std::size_t genexNesting = 0;
  cm::optional<std::string> currentEntry;
  auto processCurrentEntry = [&]() -> bool {
    // FIXME: Warn about partial genex if genexNesting > 0?
    genexNesting = 0;
    if (currentEntry) {
      assert(!haveLLT);
      if (!tll.HandleLibrary(currentProcessingState, *currentEntry,
                             GENERAL_LibraryType)) {
        return false;
      }
      currentEntry = cm::nullopt;
    }
    return true;
  };
  auto extendCurrentEntry = [&currentEntry](std::string const& arg) {
    if (currentEntry) {
      currentEntry = cmStrCat(*currentEntry, ';', arg);
    } else {
      currentEntry = arg;
    }
  };

  // Keep this list in sync with the keyword dispatch below.
  static std::unordered_set<std::string> const keywords{
    "LINK_INTERFACE_LIBRARIES",
    "INTERFACE",
    "LINK_PUBLIC",
    "PUBLIC",
    "LINK_PRIVATE",
    "PRIVATE",
    "debug",
    "optimized",
    "general",
  };

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (keywords.count(args[i])) {
      // A keyword argument terminates any accumulated partial genex.
      if (!processCurrentEntry()) {
        return false;
      }

      // Process this keyword argument.
      if (args[i] == "LINK_INTERFACE_LIBRARIES") {
        currentProcessingState = ProcessingPlainLinkInterface;
        if (i != 1) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_INTERFACE_LIBRARIES option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
      } else if (args[i] == "INTERFACE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordLinkInterface;
      } else if (args[i] == "LINK_PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPrivateInterface &&
            currentProcessingState != ProcessingPlainPublicInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPublicInterface;
      } else if (args[i] == "PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPublicInterface;
      } else if (args[i] == "LINK_PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPublicInterface &&
            currentProcessingState != ProcessingPlainPrivateInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPrivateInterface;
      } else if (args[i] == "PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPrivateInterface;
      } else if (args[i] == "debug") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, DEBUG_LibraryType);
        }
        llt = DEBUG_LibraryType;
        haveLLT = true;
      } else if (args[i] == "optimized") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, OPTIMIZED_LibraryType);
        }
        llt = OPTIMIZED_LibraryType;
        haveLLT = true;
      } else if (args[i] == "general") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, GENERAL_LibraryType);
        }
        llt = GENERAL_LibraryType;
        haveLLT = true;
      }
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      assert(!currentEntry);
      if (!tll.HandleLibrary(currentProcessingState, args[i], llt)) {
        return false;
      }
      llt = GENERAL_LibraryType;
    } else {
      // Track the genex nesting level.
      {
        cm::string_view arg = args[i];
        for (std::string::size_type pos = 0; pos < arg.size(); ++pos) {
          cm::string_view cur = arg.substr(pos);
          if (cmHasLiteralPrefix(cur, "$<")) {
            ++genexNesting;
            ++pos;
          } else if (genexNesting > 0 && cmHasLiteralPrefix(cur, ">")) {
            --genexNesting;
          }
        }
      }

      // Accumulate this argument in the current entry.
      extendCurrentEntry(args[i]);

      // Process this entry if it does not end inside a genex.
      if (genexNesting == 0) {
        if (!processCurrentEntry()) {
          return false;
        }
      }
    }
  }

  // Process the last accumulated partial genex, if any.
  if (!processCurrentEntry()) {
    return false;
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    cmStrCat("The \"", LinkLibraryTypeNames[llt],
                             "\" argument must be followed by a library."));
    cmSystemTools::SetFatalErrorOccurred();
  }

  const cmPolicies::PolicyStatus policy22Status =
    target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      currentProcessingState != ProcessingLinkLibraries &&
      !target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}